

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

Function * __thiscall LLVMBC::Module::getFunction(Module *this,String *name)

{
  pointer ppFVar1;
  int iVar2;
  String *pSVar3;
  Function *pFVar4;
  long lVar5;
  pointer ppFVar6;
  pointer ppFVar7;
  
  ppFVar6 = (this->functions).
            super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (this->functions).
            super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)ppFVar1 - (long)ppFVar6 >> 5;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    ppFVar6 = ppFVar6 + 2;
    do {
      ppFVar7 = ppFVar6;
      pSVar3 = Function::getName_abi_cxx11_(ppFVar7[-2]);
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              compare(pSVar3,name);
      if (iVar2 == 0) {
        ppFVar7 = ppFVar7 + -2;
        goto LAB_00189187;
      }
      pSVar3 = Function::getName_abi_cxx11_(ppFVar7[-1]);
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              compare(pSVar3,name);
      if (iVar2 == 0) {
        ppFVar7 = ppFVar7 + -1;
        goto LAB_00189187;
      }
      pSVar3 = Function::getName_abi_cxx11_(*ppFVar7);
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              compare(pSVar3,name);
      if (iVar2 == 0) goto LAB_00189187;
      pSVar3 = Function::getName_abi_cxx11_(ppFVar7[1]);
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              compare(pSVar3,name);
      if (iVar2 == 0) {
        ppFVar7 = ppFVar7 + 1;
        goto LAB_00189187;
      }
      lVar5 = lVar5 + -1;
      ppFVar6 = ppFVar7 + 4;
    } while (1 < lVar5);
    ppFVar6 = ppFVar7 + 2;
  }
  lVar5 = (long)ppFVar1 - (long)ppFVar6 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      ppFVar7 = ppFVar1;
      if (lVar5 != 3) goto LAB_00189187;
      pSVar3 = Function::getName_abi_cxx11_(*ppFVar6);
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              compare(pSVar3,name);
      ppFVar7 = ppFVar6;
      if (iVar2 == 0) goto LAB_00189187;
      ppFVar6 = ppFVar6 + 1;
    }
    pSVar3 = Function::getName_abi_cxx11_(*ppFVar6);
    iVar2 = std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            compare(pSVar3,name);
    ppFVar7 = ppFVar6;
    if (iVar2 == 0) goto LAB_00189187;
    ppFVar6 = ppFVar6 + 1;
  }
  pSVar3 = Function::getName_abi_cxx11_(*ppFVar6);
  iVar2 = std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::compare
                    (pSVar3,name);
  ppFVar7 = ppFVar6;
  if (iVar2 != 0) {
    ppFVar7 = ppFVar1;
  }
LAB_00189187:
  if (ppFVar7 ==
      (this->functions).
      super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pFVar4 = (Function *)0x0;
  }
  else {
    pFVar4 = *ppFVar7;
  }
  return pFVar4;
}

Assistant:

Function *Module::getFunction(const String &name) const
{
	auto itr =
	    std::find_if(functions.begin(), functions.end(), [&](const Function *func) { return func->getName() == name; });

	if (itr != functions.end())
		return *itr;
	else
		return nullptr;
}